

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::FeedbackPrimitiveTypeCase::iterate
          (FeedbackPrimitiveTypeCase *this)

{
  int iVar1;
  TestLog *pTVar2;
  MessageBuilder *this_00;
  RenderTarget *this_01;
  Vector<int,_3> local_28c;
  Vector<unsigned_int,_4> local_280;
  ConstPixelBufferAccess local_270;
  ConstPixelBufferAccess local_248;
  ConstPixelBufferAccess local_220;
  ConstPixelBufferAccess local_1f8;
  MessageBuilder local_1d0;
  bool local_4d;
  bool imageOk;
  undefined1 local_40 [8];
  Surface nonFeedbackResult;
  Surface feedbackResult;
  FeedbackPrimitiveTypeCase *this_local;
  
  tcu::Surface::Surface((Surface *)&nonFeedbackResult.m_pixels.m_cap,0x80,0x80);
  tcu::Surface::Surface((Surface *)local_40,0x80,0x80);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  renderWithFeedback(this,(Surface *)&nonFeedbackResult.m_pixels.m_cap);
  renderWithoutFeedback(this,(Surface *)local_40);
  pTVar2 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1d0,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
  this_00 = tcu::MessageBuilder::operator<<
                      (&local_1d0,
                       (char (*) [116])
                       "Comparing the image rendered with no transform feedback against the image rendered with enabled transform feedback."
                      );
  tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1d0);
  this_01 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = tcu::RenderTarget::getNumSamples(this_01);
  if (iVar1 < 2) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::Surface::getAccess
              ((PixelBufferAccess *)&local_248,(Surface *)&nonFeedbackResult.m_pixels.m_cap);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_270,(Surface *)local_40);
    tcu::Vector<unsigned_int,_4>::Vector(&local_280,8,8,8,0xff);
    tcu::Vector<int,_3>::Vector(&local_28c,1,1,0);
    local_4d = tcu::intThresholdPositionDeviationCompare
                         (pTVar2,"ImageCompare","Image comparison",&local_248,&local_270,&local_280,
                          &local_28c,true,COMPARE_LOG_RESULT);
  }
  else {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::Surface::getAccess
              ((PixelBufferAccess *)&local_1f8,(Surface *)&nonFeedbackResult.m_pixels.m_cap);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_220,(Surface *)local_40);
    local_4d = tcu::fuzzyCompare(pTVar2,"ImageCompare","Image comparison",&local_1f8,&local_220,0.03
                                 ,COMPARE_LOG_RESULT);
  }
  if (local_4d == false) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
  }
  tcu::Surface::~Surface((Surface *)local_40);
  tcu::Surface::~Surface((Surface *)&nonFeedbackResult.m_pixels.m_cap);
  return STOP;
}

Assistant:

FeedbackPrimitiveTypeCase::IterateResult FeedbackPrimitiveTypeCase::iterate (void)
{
	tcu::Surface feedbackResult		(RENDER_SIZE, RENDER_SIZE);
	tcu::Surface nonFeedbackResult	(RENDER_SIZE, RENDER_SIZE);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// render with and without XFB
	renderWithFeedback(feedbackResult);
	renderWithoutFeedback(nonFeedbackResult);

	// compare
	{
		bool imageOk;

		m_testCtx.getLog() << tcu::TestLog::Message << "Comparing the image rendered with no transform feedback against the image rendered with enabled transform feedback." << tcu::TestLog::EndMessage;

		if (m_context.getRenderTarget().getNumSamples() > 1)
			imageOk = tcu::fuzzyCompare(m_testCtx.getLog(),
										"ImageCompare",
										"Image comparison",
										feedbackResult.getAccess(),
										nonFeedbackResult.getAccess(),
										0.03f,
										tcu::COMPARE_LOG_RESULT);
		else
			imageOk = tcu::intThresholdPositionDeviationCompare(m_testCtx.getLog(),
																"ImageCompare",
																"Image comparison",
																feedbackResult.getAccess(),
																nonFeedbackResult.getAccess(),
																tcu::UVec4(8, 8, 8, 255),						//!< threshold
																tcu::IVec3(1, 1, 0),							//!< 3x3 search kernel
																true,											//!< fragments may end up over the viewport, just ignore them
																tcu::COMPARE_LOG_RESULT);

		if (!imageOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	}

	return STOP;
}